

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O3

void __thiscall
chrono::ChBodyEasyCylinder::SetupBody
          (ChBodyEasyCylinder *this,double radius,double height,double density,bool visualize,
          bool collide,shared_ptr<chrono::ChMaterialSurface> *material)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  ChCylinderShape *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined7 in_register_00000011;
  ChFrame<double> *iner;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  shared_ptr<chrono::ChCylinderShape> vshape;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  shared_ptr<chrono::ChVisualModel> local_118;
  shared_ptr<chrono::ChVisualShape> local_108;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  double local_b8;
  double local_b0;
  ChFrame<double> local_a8;
  
  local_d8 = radius * radius;
  uStack_d0 = 0;
  local_e8 = local_d8 * 3.141592653589793 * height * density;
  uStack_e0 = 0;
  (this->super_ChBody).density = (float)density;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,local_e8);
  auVar3._8_8_ = uStack_d0;
  auVar3._0_8_ = local_d8;
  iner = &local_a8;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = height * height;
  auVar5 = vfmadd231sd_fma(auVar5,auVar3,ZEXT816(0x4008000000000000));
  auVar5 = vunpcklpd_avx(auVar5,auVar3);
  auVar6._0_8_ = (_func_int **)(auVar5._0_8_ * local_e8 * 0.08333333333333333);
  auVar6._8_8_ = auVar5._8_8_ * local_e8 * 0.5;
  local_a8.coord.pos.m_data[1] = (double)vmovlpd_avx(auVar6);
  local_a8._vptr_ChFrame = auVar6._0_8_;
  local_a8.coord.pos.m_data[0] = auVar6._8_8_;
  ChBody::SetInertiaXX(&this->super_ChBody,(ChVector<double> *)iner);
  if ((int)CONCAT71(in_register_00000011,collide) != 0) {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0xa4,
                    "void chrono::ChBodyEasyCylinder::SetupBody(double, double, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_ChCollisionModel[3])();
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    local_f8 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
    p_Stack_f0 = (material->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
    p_Var2 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_c8 = ZEXT816(0) << 0x20;
    local_b8 = 0.0;
    local_a8.coord.pos.m_data[0] = 0.0;
    local_a8.coord.rot.m_data[1] = SUB328(ZEXT832(0),4);
    local_a8.coord.rot.m_data[2] = 0.0;
    local_a8.coord.rot.m_data[3] = 0.0;
    local_a8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
    local_a8.coord.rot.m_data[0] = 1.0;
    local_a8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    local_a8.coord.pos.m_data[1] = local_a8.coord.rot.m_data[1];
    local_a8.coord.pos.m_data[2] = local_a8.coord.rot.m_data[2];
    (*peVar1->_vptr_ChCollisionModel[8])(peVar1,&local_f8);
    if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
    }
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_ChCollisionModel[4])();
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    iner = (ChFrame<double> *)0x1;
    ChBody::SetCollide(&this->super_ChBody,true);
  }
  if (visualize) {
    this_00 = (ChCylinderShape *)ChVisualShape::operator_new((ChVisualShape *)0x68,(size_t)iner);
    ChCylinderShape::ChCylinderShape(this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChCylinderShape*>
              (&_Stack_120,this_00);
    (this_00->gcylinder).p1.m_data[0] = 0.0;
    (this_00->gcylinder).p1.m_data[1] = height * -0.5;
    (this_00->gcylinder).p1.m_data[2] = 0.0;
    (this_00->gcylinder).p2.m_data[0] = 0.0;
    (this_00->gcylinder).p2.m_data[1] = height * 0.5;
    (this_00->gcylinder).p2.m_data[2] = 0.0;
    (this_00->gcylinder).rad = radius;
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
    p_Var4[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var4[1]._M_use_count = 0;
    p_Var4[1]._M_weak_count = 0;
    p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var4[2]._M_use_count = 0;
    p_Var4[2]._M_weak_count = 0;
    p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var4[2]._M_use_count = 0;
    p_Var4[2]._M_weak_count = 0;
    p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var4[3]._M_use_count = 0;
    p_Var4[3]._M_weak_count = 0;
    local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_120._M_pi;
    if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_120._M_pi)->_M_use_count = (_Stack_120._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_120._M_pi)->_M_use_count = (_Stack_120._M_pi)->_M_use_count + 1;
      }
    }
    local_c8 = ZEXT816(0x3ff0000000000000);
    local_b8 = 0.0;
    local_b0 = 0.0;
    local_a8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
    local_a8.coord.pos.m_data[0] = 0.0;
    local_a8.coord.pos.m_data[1] = 0.0;
    local_a8.coord.pos.m_data[2] = 0.0;
    local_a8.coord.rot.m_data[0] = 1.0;
    local_a8.coord.rot.m_data[1] = 0.0;
    local_a8.coord.rot.m_data[2] = 0.0;
    local_a8.coord.rot.m_data[3] = 0.0;
    local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_00;
    ChMatrix33<double>::ChMatrix33(&local_a8.Amatrix,(ChQuaternion<double> *)local_c8);
    ChVisualModel::AddShape((ChVisualModel *)(p_Var4 + 1),&local_108,&local_a8);
    if (local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
    local_118.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChVisualModel *)(p_Var4 + 1);
    local_118.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var4;
    ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this,&local_118);
    if (local_118.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
    }
  }
  return;
}

Assistant:

void ChBodyEasyCylinder::SetupBody(double radius,
                                   double height,
                                   double density,
                                   bool visualize,
                                   bool collide,
                                   std::shared_ptr<ChMaterialSurface> material) {
    double mmass = density * (CH_C_PI * pow(radius, 2) * height);

    this->SetDensity((float)density);
    this->SetMass(mmass);
    this->SetInertiaXX(ChVector<>((1.0 / 12.0) * mmass * (3 * pow(radius, 2) + pow(height, 2)),
                                  0.5 * mmass * pow(radius, 2),
                                  (1.0 / 12.0) * mmass * (3 * pow(radius, 2) + pow(height, 2))));
    if (collide) {
        assert(material);
        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddCylinder(material, radius, radius, height * 0.5);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }
    if (visualize) {
        auto vshape = chrono_types::make_shared<ChCylinderShape>();
        vshape->GetCylinderGeometry().p1 = ChVector<>(0, -height * 0.5, 0);
        vshape->GetCylinderGeometry().p2 = ChVector<>(0, height * 0.5, 0);
        vshape->GetCylinderGeometry().rad = radius;
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }
}